

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# URI.cpp
# Opt level: O0

void __thiscall URI::URI(URI *this,URI *other)

{
  URI *other_local;
  URI *this_local;
  
  this->mRelative = false;
  this->mModified = false;
  this->mModifiedQuery = false;
  std::__cxx11::string::string((string *)&this->mFullString);
  std::__cxx11::string::string((string *)&this->mQueryString);
  std::__cxx11::string::string((string *)&this->mScheme);
  std::__cxx11::string::string((string *)&this->mAuthority);
  std::__cxx11::string::string((string *)&this->mPath);
  std::__cxx11::string::string((string *)&this->mFragment);
  JetHead::vector<URI::QueryParam>::vector(&this->mQueryParams);
  copyValues(this,other);
  return;
}

Assistant:

URI::URI( const URI &other )
:	mRelative(false),
	mModified(false),
	mModifiedQuery(false)
{
	copyValues(other);
}